

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

void helics::detail::convertFromBinary(byte *data,complex<double> *val)

{
  *(undefined8 *)val->_M_value = *(undefined8 *)(data + 8);
  *(undefined8 *)(val->_M_value + 8) = *(undefined8 *)(data + 0x10);
  if ((*data & 1) == 0) {
    return;
  }
  checks::swapBytes<8ul>((byte *)val);
  checks::swapBytes<8ul>(val->_M_value + 8);
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::complex<double>& val)
{
    // https://en.cppreference.com/w/cpp/numeric/complex
    //  the layout used here is guaranteed by the standard
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[0], data + 8, 8);
    std::memcpy(&reinterpret_cast<double(&)[2]>(val)[1], data + 16, 8);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val));
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val) + 8);
    }
}